

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::
logger<__gnu_cxx::__normal_iterator<std::shared_ptr<spdlog::sinks::sink>*,std::vector<std::shared_ptr<spdlog::sinks::sink>,std::allocator<std::shared_ptr<spdlog::sinks::sink>>>>>
          (logger *this,string *name,
          __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
          begin,__normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
                end)

{
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  *in_RCX;
  __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
  in_RDX;
  __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
  in_RSI;
  backtracer *in_RDI;
  string *this_00;
  allocator_type *in_stack_ffffffffffffffc8;
  
  *(undefined ***)&(in_RDI->mutex_).super___mutex_base = &PTR__logger_008d7630;
  this_00 = (string *)((long)&((_Any_data *)&(in_RDI->mutex_).super___mutex_base)->_M_unused + 8);
  std::__cxx11::string::string(this_00,(string *)in_RSI._M_current);
  std::allocator<std::shared_ptr<spdlog::sinks::sink>_>::allocator
            ((allocator<std::shared_ptr<spdlog::sinks::sink>_> *)0x51d8ae);
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,std::allocator<std::shared_ptr<spdlog::sinks::sink>>>
  ::
  vector<__gnu_cxx::__normal_iterator<std::shared_ptr<spdlog::sinks::sink>*,std::vector<std::shared_ptr<spdlog::sinks::sink>,std::allocator<std::shared_ptr<spdlog::sinks::sink>>>>,void>
            (in_RCX,in_RSI,in_RDX,in_stack_ffffffffffffffc8);
  std::allocator<std::shared_ptr<spdlog::sinks::sink>_>::~allocator
            ((allocator<std::shared_ptr<spdlog::sinks::sink>_> *)0x51d8d3);
  std::atomic<int>::atomic((atomic<int> *)in_RDI,(__integral_type)((ulong)this_00 >> 0x20));
  std::atomic<int>::atomic((atomic<int> *)in_RDI,(__integral_type)((ulong)this_00 >> 0x20));
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_RDI,this_00);
  details::backtracer::backtracer(in_RDI);
  return;
}

Assistant:

logger(std::string name, It begin, It end)
        : name_(std::move(name)),
          sinks_(begin, end) {}